

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

Mio_Library_t *
Abc_SclDeriveGenlib(void *pScl,void *pMio,float SlewInit,float Gain,int nGatesMin,int fVerbose)

{
  char *FileName;
  char *pBuffer;
  Mio_Library_t *pMVar1;
  float local_54;
  Mio_Library_t *pLib;
  Vec_Str_t *vStr;
  float Slew;
  SC_Lib *p;
  int local_28;
  int nCellCount;
  int fVerbose_local;
  int nGatesMin_local;
  float Gain_local;
  float SlewInit_local;
  void *pMio_local;
  void *pScl_local;
  
  p._4_4_ = 0;
  local_54 = SlewInit;
  local_28 = fVerbose;
  nCellCount = nGatesMin;
  fVerbose_local = (int)Gain;
  nGatesMin_local = (int)SlewInit;
  _Gain_local = (Mio_Library_t *)pMio;
  pMio_local = pScl;
  if ((SlewInit == 0.0) && (!NAN(SlewInit))) {
    local_54 = Abc_SclComputeAverageSlew((SC_Lib *)pScl);
  }
  if (_Gain_local == (Mio_Library_t *)0x0) {
    pLib = (Mio_Library_t *)
           Abc_SclProduceGenlibStr
                     ((SC_Lib *)pScl,local_54,(float)fVerbose_local,nCellCount,(int *)((long)&p + 4)
                     );
  }
  else {
    pLib = (Mio_Library_t *)
           Abc_SclProduceGenlibStrProfile
                     ((SC_Lib *)pScl,_Gain_local,local_54,(float)fVerbose_local,nCellCount,
                      (int *)((long)&p + 4));
  }
  FileName = *(char **)((long)pScl + 8);
  pBuffer = Vec_StrArray((Vec_Str_t *)pLib);
  pMVar1 = Mio_LibraryRead(FileName,pBuffer,(char *)0x0,0);
  Vec_StrFree((Vec_Str_t *)pLib);
  if (pMVar1 == (Mio_Library_t *)0x0) {
    printf("Reading library has filed.\n");
  }
  else if (local_28 != 0) {
    printf("Derived GENLIB library \"%s\" with %d gates using slew %.2f ps and gain %.2f.\n",
           (double)local_54,(double)(float)fVerbose_local,*pScl,(ulong)p._4_4_);
  }
  return pMVar1;
}

Assistant:

Mio_Library_t * Abc_SclDeriveGenlib( void * pScl, void * pMio, float SlewInit, float Gain, int nGatesMin, int fVerbose )
{
    int nCellCount = 0;
    SC_Lib * p = (SC_Lib *)pScl;
    float Slew = (SlewInit == 0) ? Abc_SclComputeAverageSlew(p) : SlewInit;
    Vec_Str_t * vStr;
    Mio_Library_t * pLib;
    if ( pMio == NULL )
        vStr = Abc_SclProduceGenlibStr( p, Slew, Gain, nGatesMin, &nCellCount );
    else
        vStr = Abc_SclProduceGenlibStrProfile( p, (Mio_Library_t *)pMio, Slew, Gain, nGatesMin, &nCellCount );
    pLib = Mio_LibraryRead( p->pFileName, Vec_StrArray(vStr), NULL, 0 );  
    Vec_StrFree( vStr );
    if ( !pLib )
        printf( "Reading library has filed.\n" );
    else if ( fVerbose )
        printf( "Derived GENLIB library \"%s\" with %d gates using slew %.2f ps and gain %.2f.\n", p->pName, nCellCount, Slew, Gain );
    return pLib;
}